

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

UBool __thiscall icu_63::Calendar::isWeekend(Calendar *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  UErrorCode status;
  UErrorCode local_2c;
  
  uVar4 = 0;
  local_2c = U_ZERO_ERROR;
  complete(this,&local_2c);
  if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar4 = this->fFields[7];
  }
  iVar2 = (*(this->super_UObject)._vptr_UObject[0x18])(this,(ulong)uVar4,&local_2c);
  if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
    if (iVar2 - 2U < 2) {
      iVar1 = this->fFields[0x15];
      iVar3 = (*(this->super_UObject)._vptr_UObject[0x19])(this,(ulong)uVar4,&local_2c);
      if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
        return (iVar2 == 2) != iVar1 < iVar3;
      }
    }
    else if ((iVar2 != 0) && (iVar2 == 1)) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

UBool
Calendar::isWeekend(void) const
{
    UErrorCode status = U_ZERO_ERROR;
    UCalendarDaysOfWeek dayOfWeek = (UCalendarDaysOfWeek)get(UCAL_DAY_OF_WEEK, status);
    UCalendarWeekdayType dayType = getDayOfWeekType(dayOfWeek, status);
    if (U_SUCCESS(status)) {
        switch (dayType) {
            case UCAL_WEEKDAY:
                return FALSE;
            case UCAL_WEEKEND:
                return TRUE;
            case UCAL_WEEKEND_ONSET:
            case UCAL_WEEKEND_CEASE:
                // Use internalGet() because the above call to get() populated all fields.
                {
                    int32_t millisInDay = internalGet(UCAL_MILLISECONDS_IN_DAY);
                    int32_t transitionMillis = getWeekendTransition(dayOfWeek, status);
                    if (U_SUCCESS(status)) {
                        return (dayType == UCAL_WEEKEND_ONSET)?
                            (millisInDay >= transitionMillis):
                            (millisInDay <  transitionMillis);
                    }
                    // else fall through, return FALSE
                    U_FALLTHROUGH;
                }
            default:
                break;
        }
    }
    return FALSE;
}